

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

FloatMixTexture *
pbrt::FloatMixTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  int iVar1;
  undefined4 extraout_var;
  allocator<char> local_93;
  allocator<char> local_92;
  allocator<char> local_91;
  undefined1 local_90 [16];
  undefined1 local_80 [40];
  string local_58 [32];
  string local_38 [32];
  FloatMixTexture *pFVar2;
  
  std::__cxx11::string::string<std::allocator<char>>(local_38,"tex1",&local_91);
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)local_80,(string *)parameters,0.0,
             (memory_resource *)local_38);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"tex2",&local_92);
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)(local_90 + 8),(string *)parameters,1.0,
             (memory_resource *)local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_80 + 8),"amount",&local_93);
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)local_90,(string *)parameters,0.5,
             (memory_resource *)(local_80 + 8));
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x18,8);
  pFVar2 = (FloatMixTexture *)CONCAT44(extraout_var,iVar1);
  (pFVar2->tex1).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_80._0_8_;
  (pFVar2->tex2).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_90._8_8_;
  (pFVar2->amount).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_90._0_8_;
  std::__cxx11::string::~string((string *)(local_80 + 8));
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return pFVar2;
}

Assistant:

FloatMixTexture *FloatMixTexture::Create(const Transform &renderFromTexture,
                                         const TextureParameterDictionary &parameters,
                                         const FileLoc *loc, Allocator alloc) {
    return alloc.new_object<FloatMixTexture>(
        parameters.GetFloatTexture("tex1", 0.f, alloc),
        parameters.GetFloatTexture("tex2", 1.f, alloc),
        parameters.GetFloatTexture("amount", 0.5f, alloc));
}